

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<char[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
          (char (*arg) [2],char *args,char (*args_1) [2],unsigned_long *args_2,char (*args_3) [2],
          char *args_4)

{
  char (*in_RCX) [2];
  char *in_RDX;
  undefined8 in_RDI;
  unsigned_long *in_R8;
  char (*in_R9) [2];
  string local_70 [8];
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [24];
  char *in_stack_ffffffffffffffc8;
  
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff98);
  StringBuilder<char,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}